

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

uint32_t lrtr_get_bits(uint32_t val,uint8_t from,uint8_t number)

{
  uint uVar1;
  char *__assertion;
  long in_FS_OFFSET;
  
  if (0x20 < number) {
    __assertion = "number < 33";
    uVar1 = 0x2c;
LAB_00105dc9:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/utils.c"
                  ,uVar1,"uint32_t lrtr_get_bits(const uint32_t, const uint8_t, const uint8_t)");
  }
  if (number == ' ') {
    uVar1 = 0xffffffff;
  }
  else {
    if (number == '\0') {
      __assertion = "number > 0";
      uVar1 = 0x2d;
      goto LAB_00105dc9;
    }
    uVar1 = ~(0xffffffffU >> (number & 0x1f));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar1 >> (from & 0x1f) & val;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t lrtr_get_bits(const uint32_t val, const uint8_t from, const uint8_t number)
{
	assert(number < 33);
	assert(number > 0);

	uint32_t mask = ~0;

	if (number != 32)
		mask = ~(mask >> number);

	mask >>= from;
	return (mask & val);
}